

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

pair<int,_int> Utils::FindMax(Matrix *m,int start)

{
  uint uVar1;
  uint uVar2;
  uint j;
  ulong uVar3;
  uint i;
  double dVar4;
  double dVar5;
  
  uVar1 = Matrix::GetCols(m);
  dVar4 = Matrix::operator()(m,start,start);
  uVar2 = start;
  if (start < (int)uVar1) {
    dVar4 = ABS(dVar4);
    uVar3 = (ulong)(uint)start;
    j = start;
    i = start;
    do {
      dVar5 = Matrix::operator()(m,i,j);
      if (dVar4 < ABS(dVar5)) {
        uVar3 = (ulong)j;
        dVar4 = ABS(dVar5);
        uVar2 = i;
      }
      j = j + 1;
    } while ((uVar1 != j) || (i = i + 1, j = start, i != uVar1));
  }
  else {
    uVar3 = (ulong)(uint)start;
  }
  return (pair<int,_int>)((ulong)uVar2 | uVar3 << 0x20);
}

Assistant:

std::pair<int, int> Utils::FindMax(const Matrix& m, int start)
{
    const int n = m.GetCols();
    double max = std::abs(m(start, start));
    std::pair<int, int> indexes = {start, start};

    for (int i = start; i < n; ++i)
    {
        for (int j = start; j < n; ++j)
        {
            const double curr = std::abs(m(i, j));
            if (curr > max)
            {
                max = curr;
                indexes = {i, j};
            }
        }
    }
    return indexes;
}